

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxSuper::Resolve(FxSuper *this,FCompileContext *ctx)

{
  if ((this->super_FxSelf).super_FxExpression.isresolved == false) {
    (this->super_FxSelf).super_FxExpression.isresolved = true;
    if ((ctx->Function == (PFunction *)0x0) ||
       (((ctx->Function->Variants).Array)->SelfClass == (PStruct *)0x0)) {
      FScriptPosition::Message
                (&(this->super_FxSelf).super_FxExpression.ScriptPosition,2,
                 "super used outside of a member function");
      (*(this->super_FxSelf).super_FxExpression._vptr_FxExpression[1])(this);
      this = (FxSuper *)0x0;
    }
    else {
      (this->super_FxSelf).super_FxExpression.ValueType = &TypeError->super_PType;
    }
  }
  return (FxExpression *)this;
}

Assistant:

FxExpression *FxSuper::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	if (ctx.Function == nullptr || ctx.Function->Variants[0].SelfClass == nullptr)
	{
		ScriptPosition.Message(MSG_ERROR, "super used outside of a member function");
		delete this;
		return nullptr;
	}
	ValueType = TypeError;	// this intentionally resolves to an invalid type so that it cannot be used outside of super calls.
	return this;
}